

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::filterPageContents(QPDFObjectHandle *this,TokenFilter *filter,Pipeline *next)

{
  element_type *peVar1;
  Pl_QPDFTokenizer token_pipeline;
  QPDFObjGen local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_48.obj = 0;
    local_48.gen = 0;
  }
  else {
    local_48 = peVar1->og;
  }
  QPDFObjGen::unparse_abi_cxx11_((string *)&token_pipeline,&local_48,' ');
  std::operator+(&description,"token filter for page object ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &token_pipeline);
  std::__cxx11::string::~string((string *)&token_pipeline);
  Pl_QPDFTokenizer::Pl_QPDFTokenizer(&token_pipeline,description._M_dataplus._M_p,filter,next);
  pipePageContents(this,&token_pipeline.super_Pipeline);
  Pl_QPDFTokenizer::~Pl_QPDFTokenizer(&token_pipeline);
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
QPDFObjectHandle::filterPageContents(TokenFilter* filter, Pipeline* next)
{
    auto description = "token filter for page object " + getObjGen().unparse(' ');
    Pl_QPDFTokenizer token_pipeline(description.c_str(), filter, next);
    this->pipePageContents(&token_pipeline);
}